

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O2

void __thiscall Centaurus::ATNMachine<char>::parse_atom(ATNMachine<char> *this,Stream *stream)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer pAVar4;
  pointer pAVar5;
  wchar_t wVar6;
  StreamException *__return_storage_ptr__;
  int iVar7;
  ATNNode<char> *this_00;
  int iVar8;
  ATNNodeType local_cc;
  ATNNode<char> node;
  
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pAVar2 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  wVar6 = Stream::skip_whitespace(stream);
  pAVar3 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pAVar4 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (wVar6 == L'(') {
    Stream::get(stream);
    parse_selection(this,stream);
    wVar6 = Stream::skip_whitespace(stream);
    if (wVar6 != L')') {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,wVar6);
      __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                  StreamException::~StreamException);
    }
    Stream::get(stream);
  }
  else {
    ATNNode<char>::ATNNode(&node,stream);
    if ((0 < this->m_globalid) && ((node.m_type & ~Nonterminal) == LiteralTerminal)) {
      pAVar5 = (this->m_nodes).
               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ATNNode<char>::add_transition
                (pAVar5 + -1,
                 (int)(((long)pAVar5 -
                       (long)(this->m_nodes).
                             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x98),0);
      local_cc = WhiteSpace;
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
      emplace_back<Centaurus::ATNNodeType>(&this->m_nodes,&local_cc);
    }
    pAVar5 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ATNNode<char>::add_transition
              (pAVar5 + -1,
               (int)(((long)pAVar5 -
                     (long)(this->m_nodes).
                           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x98),0);
    std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::push_back
              (&this->m_nodes,&node);
    ATNNode<char>::~ATNNode(&node);
  }
  iVar8 = (int)(((long)pAVar1 - (long)pAVar2) / 0x98) + -1;
  wVar6 = Stream::skip_whitespace(stream);
  if (wVar6 == L'?') {
    add_node(this,(int)(((long)(this->m_nodes).
                               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_nodes).
                              super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x98) + -1,0);
    pAVar1 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = pAVar1 + iVar8;
    iVar7 = (int)(((long)(this->m_nodes).
                         super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x98);
  }
  else {
    iVar7 = (int)(((long)pAVar3 - (long)pAVar4) / 0x98);
    if (wVar6 == L'+') {
      add_node(this,(int)(((long)(this->m_nodes).
                                 super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_nodes).
                                super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x98) + -1,0);
      this_00 = (this->m_nodes).
                super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      goto LAB_0014b64e;
    }
    if (wVar6 != L'*') {
      return;
    }
    add_node(this,(int)(((long)(this->m_nodes).
                               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_nodes).
                              super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x98) + -1,0);
    ATNNode<char>::add_transition
              ((this->m_nodes).
               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,iVar7,0);
    add_node(this,(int)(((long)(this->m_nodes).
                               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_nodes).
                              super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x98) + -1,0);
    pAVar1 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = pAVar1 + iVar8;
    iVar7 = (int)(((long)(this->m_nodes).
                         super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x98);
  }
  iVar7 = iVar7 + -1;
LAB_0014b64e:
  ATNNode<char>::add_transition(this_00,iVar7,0);
  Stream::get(stream);
  return;
}

Assistant:

void ATNMachine<TCHAR>::parse_atom(Stream& stream)
{
	int origin_state = m_nodes.size() - 1;
	wchar_t ch = stream.skip_whitespace();

	int anchor_state = m_nodes.size();

	if (ch == L'(')
	{
		stream.discard();
		parse_selection(stream);

		ch = stream.skip_whitespace();
		if (ch != L')')
			throw stream.unexpected(ch);
		stream.discard();
	}
	else
	{
        ATNNode<TCHAR> node(stream);

        if (m_globalid > 0 && (node.type() == ATNNodeType::LiteralTerminal || node.type() == ATNNodeType::RegularTerminal))
        {
            m_nodes.back().add_transition(m_nodes.size());
            m_nodes.emplace_back(ATNNodeType::WhiteSpace);
        }

		m_nodes.back().add_transition(m_nodes.size());
		m_nodes.push_back(node);
	}

	ch = stream.skip_whitespace();
	switch (ch)
	{
	case L'*':
		add_node(m_nodes.size() - 1);
		m_nodes.back().add_transition(anchor_state);
		add_node(m_nodes.size() - 1);
		m_nodes[origin_state].add_transition(m_nodes.size() - 1);
		stream.discard();
		break;
	case L'+':
		add_node(m_nodes.size() - 1);
		m_nodes.back().add_transition(anchor_state);
		stream.discard();
		break;
	case L'?':
		add_node(m_nodes.size() - 1);
		m_nodes[origin_state].add_transition(m_nodes.size() - 1);
		stream.discard();
		break;
	}
}